

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLMeshLoader.cpp
# Opt level: O0

bool __thiscall
COLLADASaxFWL::MeshLoader::appendVertexValues
          (MeshLoader *this,SourceBase *sourceBase,MeshVertexData *vertexData)

{
  BaseArrayElement<float> *this_00;
  MeshVertexData *this_01;
  BaseArrayElement<double> *this_02;
  ArrayPrimitiveType<double> *stride;
  String *name;
  ostream *poVar1;
  FloatArray *in_RDX;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *in_RSI;
  ArrayPrimitiveType<double> *valuesArray_1;
  DoubleArrayElement *arrayElement_1;
  DoubleSource *source_1;
  ArrayPrimitiveType<float> *valuesArray;
  FloatArrayElement *arrayElement;
  FloatSource *source;
  DataType *dataType;
  size_t initialIndex;
  bool retValue;
  FloatOrDoubleArray *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff68;
  String *in_stack_ffffffffffffff70;
  DoubleArray *in_stack_ffffffffffffff78;
  MeshVertexData *in_stack_ffffffffffffff80;
  int local_34;
  int *local_30;
  size_t local_28;
  byte local_19;
  FloatArray *local_18;
  Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2> *local_10;
  
  local_19 = 1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = COLLADAFW::FloatOrDoubleArray::getValuesCount(in_stack_ffffffffffffff58);
  SourceBase::setInitialIndex(&local_10->super_SourceBase,local_28);
  local_34 = (*(local_10->super_SourceBase)._vptr_SourceBase[2])();
  local_30 = &local_34;
  if (local_34 == 2) {
    this_00 = Source<COLLADASaxFWL::BaseArrayElement<float>,_(COLLADASaxFWL::SourceBase::DataType)2>
              ::getArrayElement(local_10);
    this_01 = (MeshVertexData *)BaseArrayElement<float>::getValues(this_00);
    SourceBase::getId_abi_cxx11_(&local_10->super_SourceBase);
    SourceBase::getStride(&local_10->super_SourceBase);
    COLLADAFW::MeshVertexData::appendValues
              (this_01,local_18,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  else if (local_34 == 3) {
    this_02 = Source<COLLADASaxFWL::BaseArrayElement<double>,_(COLLADASaxFWL::SourceBase::DataType)3>
              ::getArrayElement((Source<COLLADASaxFWL::BaseArrayElement<double>,_(COLLADASaxFWL::SourceBase::DataType)3>
                                 *)local_10);
    stride = BaseArrayElement<double>::getValues(this_02);
    name = SourceBase::getId_abi_cxx11_(&local_10->super_SourceBase);
    SourceBase::getStride(&local_10->super_SourceBase);
    COLLADAFW::MeshVertexData::appendValues
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,name,(size_t)stride);
  }
  else {
    poVar1 = std::operator<<((ostream *)&std::cerr,
                             "Source has an other datatype as float or double! ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,*local_30);
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_19 = 0;
  }
  return (bool)(local_19 & 1);
}

Assistant:

bool MeshLoader::appendVertexValues ( 
        SourceBase* sourceBase, 
        COLLADAFW::MeshVertexData &vertexData )
    {
        bool retValue = true;

        // Check if there are already some values in the positions list.
        // If so, we have to store the last index to increment the following indexes.
        const size_t initialIndex = vertexData.getValuesCount ();
        sourceBase->setInitialIndex ( initialIndex );

        // Get the source input array
        const SourceBase::DataType& dataType = sourceBase->getDataType ();
        switch ( dataType )
        {
        case SourceBase::DATA_TYPE_FLOAT:
            {
                // Get the values array from the source
                FloatSource* source = ( FloatSource* ) sourceBase;
                FloatArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<float>& valuesArray = arrayElement.getValues ();

                // Push the values with the infos into the list.
                vertexData.appendValues ( valuesArray, source->getId (), (size_t) source->getStride () );

                break;  
            }
        case SourceBase::DATA_TYPE_DOUBLE:
            {
                // Get the values array from the source
                DoubleSource* source = ( DoubleSource* ) sourceBase;
                DoubleArrayElement& arrayElement = source->getArrayElement ();
                COLLADAFW::ArrayPrimitiveType<double>& valuesArray = arrayElement.getValues ();

                // Push the values with the infos into the list.
                vertexData.appendValues ( valuesArray, source->getId (), (size_t) source->getStride () );

                break;
            }
        default:
            std::cerr << "Source has an other datatype as float or double! " << dataType << std::endl;
            retValue = false;
        }

        return retValue;
    }